

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsCopyAndAssignment(void)

{
  initializer_list<int> __l;
  size_t sVar1;
  ostream *poVar2;
  Span<int,_18446744073709551615UL> SVar3;
  undefined1 auStack_a8 [8];
  Span<int,_18446744073709551615UL> other;
  undefined1 auStack_88 [8];
  Span<int,_18446744073709551615UL> copied;
  Span<int,_18446744073709551615UL> span;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  SVar3 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  copied.m_ptr = (pointer)SVar3.m_size.m_size;
  auStack_88 = (undefined1  [8])SVar3.m_ptr;
  sVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                    ((Span<int,_18446744073709551615UL> *)auStack_88);
  if (sVar1 == 4) {
    MILBlob::Util::Span<int,_18446744073709551615UL>::Span<18446744073709551615UL,_0>
              ((Span<int,_18446744073709551615UL> *)auStack_a8);
    auStack_a8 = auStack_88;
    other.m_ptr = copied.m_ptr;
    sVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                      ((Span<int,_18446744073709551615UL> *)auStack_a8);
    if (sVar1 == 4) {
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb8);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(other.Size()) == (size_t(4))");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb4);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(copied.Size()) == (size_t(4))");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int testSpanTestsCopyAndAssignment()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    auto copied(span);
    ML_ASSERT_EQ(copied.Size(), size_t(4));

    Span<int> other;
    other = copied;
    ML_ASSERT_EQ(other.Size(), size_t(4));

    return 0;
}